

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

string * __thiscall
cs_impl::any::holder<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  any *paVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  any *paVar5;
  any *this_00;
  string str;
  long *local_98;
  long local_88;
  long lStack_80;
  _Alloc_hider local_78;
  size_type local_70;
  undefined2 local_68;
  undefined6 uStack_66;
  undefined8 uStack_60;
  string *local_58;
  string local_50;
  
  this_00 = *(any **)((long)this + 0x18);
  paVar1 = *(any **)((long)this + 0x38);
  local_58 = __return_storage_ptr__;
  if (paVar1 == this_00) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(undefined2 *)&__return_storage_ptr__->field_2 = 0x7d7b;
    __return_storage_ptr__->_M_string_length = 2;
    (__return_storage_ptr__->field_2)._M_local_buf[2] = '\0';
  }
  else {
    local_78._M_p = (pointer)&local_68;
    local_68 = 0x7b;
    local_70 = 1;
    paVar5 = *(any **)((long)this + 0x28);
    lVar4 = *(long *)((long)this + 0x30);
    do {
      any::to_string_abi_cxx11_(&local_50,this_00);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_88 = *plVar3;
        lStack_80 = plVar2[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar3;
        local_98 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98);
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
      if (this_00 == paVar5) {
        this_00 = *(any **)(lVar4 + 8);
        lVar4 = lVar4 + 8;
        paVar5 = this_00 + 0x40;
      }
    } while (this_00 != paVar1);
    std::__cxx11::string::resize((ulong)&local_78,(char)local_70 + -2);
    std::__cxx11::string::append((char *)&local_78);
    (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
    if (local_78._M_p == (pointer)&local_68) {
      (local_58->field_2)._M_allocated_capacity = CONCAT62(uStack_66,local_68);
      *(undefined8 *)((long)&local_58->field_2 + 8) = uStack_60;
    }
    else {
      (local_58->_M_dataplus)._M_p = local_78._M_p;
      (local_58->field_2)._M_allocated_capacity = CONCAT62(uStack_66,local_68);
    }
    local_58->_M_string_length = local_70;
  }
  return local_58;
}

Assistant:

static inline _To convert(T &&val) noexcept
		{
			return std::move(static_cast<_To>(std::forward<T>(val)));
		}